

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

ostream * tchecker::clockbounds::operator<<(ostream *os,global_lu_map_t *map)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"L=");
  operator<<(poVar1,map->_L);
  poVar1 = std::operator<<(poVar1," U=");
  operator<<(poVar1,map->_U);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::clockbounds::global_lu_map_t const & map)
{
  return os << "L=" << map.L() << " U=" << map.U() << std::endl;
}